

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O1

void GraphTask::run_bfs(task_data *D,multi_ex *ec)

{
  pointer *ppuVar1;
  int iVar2;
  pointer puVar3;
  iterator iVar4;
  pointer pvVar5;
  unsigned_long uVar6;
  example *peVar7;
  wclass *pwVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  pointer puVar12;
  vector<unsigned_int,std::allocator<unsigned_int>> *this;
  long lVar13;
  vector<bool,_std::allocator<bool>_> touched;
  uint local_84;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_58;
  task_data *local_50;
  multi_ex *local_48;
  ulong local_40;
  pointer local_38;
  
  puVar3 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_48 = ec;
  if (D->N != 0) {
    uVar11 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_80,false);
      uVar11 = uVar11 + 1;
    } while (uVar11 < D->N);
  }
  local_58 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&D->bfs;
  *local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
   super__Bit_iterator_base._M_p =
       *local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p | 1;
  local_84 = 0;
  iVar4._M_current =
       (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,iVar4,&local_84);
  }
  else {
    *iVar4._M_current = 0;
    ppuVar1 = &(D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  if ((ulong)((long)(D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2) < (ulong)D->N) {
    uVar11 = 0;
    this = local_58;
    local_50 = D;
    do {
      while( true ) {
        puVar3 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (long)(D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
        if (uVar10 <= uVar11) break;
        uVar9 = puVar3[uVar11];
        pvVar5 = (D->adj).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar12 = pvVar5[uVar9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_38 = *(pointer *)
                    ((long)&pvVar5[uVar9].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8);
        local_40 = uVar11;
        if (puVar12 != local_38) {
          do {
            uVar6 = *puVar12;
            peVar7 = (local_48->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar6];
            pwVar8 = (peVar7->l).cs.costs._begin;
            if ((peVar7->l).cs.costs._end != pwVar8) {
              lVar13 = 4;
              uVar11 = 0;
              do {
                iVar2 = *(int *)((long)&pwVar8->x + lVar13);
                if (iVar2 != 0) {
                  uVar9 = iVar2 - 1;
                  if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6]
                       >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
                    iVar4._M_current =
                         (local_50->bfs).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    local_84 = uVar9;
                    if (iVar4._M_current ==
                        (local_50->bfs).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,iVar4,
                                 &local_84);
                      this = local_58;
                    }
                    else {
                      *iVar4._M_current = uVar9;
                      ppuVar1 = &(local_50->bfs).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                      *ppuVar1 = *ppuVar1 + 1;
                    }
                    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] =
                         local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6]
                         | 1L << ((byte)uVar9 & 0x3f);
                  }
                }
                uVar11 = uVar11 + 1;
                peVar7 = (local_48->super__Vector_base<example_*,_std::allocator<example_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar6];
                pwVar8 = (peVar7->l).cs.costs._begin;
                lVar13 = lVar13 + 0x10;
              } while (uVar11 < (ulong)((long)(peVar7->l).cs.costs._end - (long)pwVar8 >> 4));
            }
            puVar12 = puVar12 + 1;
          } while (puVar12 != local_38);
        }
        uVar11 = local_40 + 1;
        D = local_50;
      }
      uVar9 = D->N;
      if (uVar10 < uVar9) {
        if (uVar9 == 0) {
          local_84 = 0;
        }
        else {
          uVar10 = 0;
          do {
            if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] >>
                 (uVar10 & 0x3f) & 1) == 0) {
              local_84 = (uint)uVar10;
              local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] =
                   local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] |
                   1L << ((byte)uVar10 & 0x3f);
              iVar4._M_current =
                   (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(this,iVar4,&local_84);
                this = local_58;
              }
              else {
                *iVar4._M_current = local_84;
                ppuVar1 = &(D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              break;
            }
            uVar10 = uVar10 + 1;
            local_84 = uVar9;
          } while (uVar9 != (uint)uVar10);
        }
      }
    } while ((ulong)((long)(D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2) < (ulong)D->N);
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void run_bfs(task_data& D, multi_ex& ec)
{
  D.bfs.clear();
  vector<bool> touched;
  for (size_t n = 0; n < D.N; n++) touched.push_back(false);

  touched[0] = true;
  D.bfs.push_back(0);

  size_t i = 0;
  while (D.bfs.size() < D.N)
  {
    while (i < D.bfs.size())
    {
      uint32_t n = D.bfs[i];
      for (size_t id : D.adj[n])
        for (size_t j = 0; j < ec[id]->l.cs.costs.size(); j++)
        {
          uint32_t m = ec[id]->l.cs.costs[j].class_index;
          if ((m > 0) && (!touched[m - 1]))
          {
            D.bfs.push_back(m - 1);
            touched[m - 1] = true;
          }
        }
      i++;
    }

    if (D.bfs.size() < D.N)
      // we finished a SCC, need to find another
      for (uint32_t n = 0; n < D.N; n++)
        if (!touched[n])
        {
          touched[n] = true;
          D.bfs.push_back(n);
          break;
        }
  }
}